

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_decorations.cpp
# Opt level: O0

uint32_t spvtools::val::anon_unknown_0::getSize
                   (uint32_t member_id,LayoutConstraints *inherited,MemberConstraints *constraints,
                   ValidationState_t *vstate)

{
  value_type vVar1;
  Instruction *this;
  ValidationState_t *this_00;
  bool bVar2;
  Op OVar3;
  int32_t iVar4;
  int iVar5;
  Decoration DVar6;
  uint32_t uVar7;
  size_type sVar8;
  const_reference pvVar9;
  pointer pDVar10;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar11;
  const_reference pvVar12;
  pair<unsigned_int,_unsigned_int> local_e0;
  mapped_type *local_d8;
  mapped_type *constraint;
  const_iterator decoration;
  FieldDecorationsIter member_decorations;
  uint32_t offset;
  value_type *lastMember;
  uint32_t lastIdx;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_88;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *members;
  uint32_t local_78;
  uint32_t scalar_elem_size;
  value_type scalar_elem_type;
  value_type num_rows;
  Instruction *component_inst;
  value_type column_type;
  value_type num_columns;
  uint32_t size_1;
  uint32_t elem_size;
  uint32_t elem_type;
  uint32_t num_elem;
  Instruction *sizeInst;
  uint size;
  uint32_t componentSize;
  value_type numComponents;
  value_type componentId;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *words;
  Instruction *inst;
  ValidationState_t *vstate_local;
  MemberConstraints *constraints_local;
  LayoutConstraints *inherited_local;
  uint32_t member_id_local;
  
  inst = (Instruction *)vstate;
  vstate_local = (ValidationState_t *)constraints;
  constraints_local = (MemberConstraints *)inherited;
  inherited_local._0_4_ = member_id;
  words = &ValidationState_t::FindDef(vstate,member_id)->words_;
  _numComponents = Instruction::words((Instruction *)words);
  OVar3 = Instruction::opcode((Instruction *)words);
  this = inst;
  if (OVar3 - OpTypeInt < 2) {
    pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](_numComponents,2);
    inherited_local._4_4_ = *pvVar9 >> 3;
  }
  else if (OVar3 == OpTypeVector) {
    pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](_numComponents,2);
    componentSize = *pvVar9;
    pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](_numComponents,3);
    size = *pvVar9;
    uVar7 = getSize(componentSize,(LayoutConstraints *)constraints_local,
                    (MemberConstraints *)vstate_local,(ValidationState_t *)inst);
    inherited_local._4_4_ = uVar7 * size;
  }
  else if (OVar3 == OpTypeMatrix) {
    pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](_numComponents,3);
    component_inst._4_4_ = *pvVar9;
    if (*(int *)&(constraints_local->_M_h)._M_buckets == 1) {
      inherited_local._4_4_ =
           component_inst._4_4_ * *(int *)((long)&(constraints_local->_M_h)._M_buckets + 4);
    }
    else {
      pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (_numComponents,2);
      component_inst._0_4_ = *pvVar9;
      _scalar_elem_type =
           ValidationState_t::FindDef((ValidationState_t *)inst,(uint32_t)component_inst);
      pvVar11 = Instruction::words(_scalar_elem_type);
      pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar11,3);
      scalar_elem_size = *pvVar9;
      pvVar11 = Instruction::words(_scalar_elem_type);
      pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar11,2);
      local_78 = *pvVar9;
      uVar7 = getSize(local_78,(LayoutConstraints *)constraints_local,
                      (MemberConstraints *)vstate_local,(ValidationState_t *)inst);
      inherited_local._4_4_ =
           (scalar_elem_size - 1) * *(int *)((long)&(constraints_local->_M_h)._M_buckets + 4) +
           component_inst._4_4_ * uVar7;
    }
  }
  else if (OVar3 - OpTypeImage < 3) {
    bVar2 = ValidationState_t::HasCapability((ValidationState_t *)inst,BindlessTextureNV);
    if (!bVar2) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_decorations.cpp"
                    ,0x128,
                    "uint32_t spvtools::val::(anonymous namespace)::getSize(uint32_t, const LayoutConstraints &, MemberConstraints &, ValidationState_t &)"
                   );
    }
    uVar7 = ValidationState_t::samplerimage_variable_address_mode((ValidationState_t *)inst);
    inherited_local._4_4_ = uVar7 >> 3;
  }
  else if (OVar3 == OpTypeArray) {
    pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](_numComponents,3);
    _elem_type = ValidationState_t::FindDef((ValidationState_t *)this,*pvVar9);
    OVar3 = Instruction::opcode(_elem_type);
    iVar4 = spvOpcodeIsSpecConstant(OVar3);
    if (iVar4 == 0) {
      OVar3 = Instruction::opcode(_elem_type);
      if (OVar3 != OpConstant) {
        __assert_fail("spv::Op::OpConstant == sizeInst->opcode()",
                      "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_decorations.cpp"
                      ,0x138,
                      "uint32_t spvtools::val::(anonymous namespace)::getSize(uint32_t, const LayoutConstraints &, MemberConstraints &, ValidationState_t &)"
                     );
      }
      pvVar11 = Instruction::words(_elem_type);
      pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar11,3);
      elem_size = *pvVar9;
      pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (_numComponents,2);
      size_1 = *pvVar9;
      num_columns = getSize(size_1,(LayoutConstraints *)constraints_local,
                            (MemberConstraints *)vstate_local,(ValidationState_t *)inst);
      iVar5 = elem_size - 1;
      uVar7 = GetArrayStride((uint32_t)inherited_local,(ValidationState_t *)inst);
      inherited_local._4_4_ = iVar5 * uVar7 + num_columns;
    }
    else {
      inherited_local._4_4_ = 0;
    }
  }
  else if (OVar3 == OpTypeRuntimeArray) {
    inherited_local._4_4_ = 0;
  }
  else if (OVar3 == OpTypeStruct) {
    getStructMembers((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&lastIdx,
                     (uint32_t)inherited_local,(ValidationState_t *)inst);
    local_88 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&lastIdx;
    bVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(local_88);
    if (bVar2) {
      inherited_local._4_4_ = 0;
    }
    else {
      sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_88);
      lastMember._0_4_ = (int)sVar8 - 1;
      pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back(local_88);
      member_decorations.end._M_node._4_4_ = 0xffffffff;
      _decoration = ValidationState_t::id_member_decorations
                              ((ValidationState_t *)inst,(uint32_t)inherited_local,
                               (uint32_t)lastMember);
      constraint = (mapped_type *)decoration._M_node;
      while( true ) {
        bVar2 = std::operator!=((_Self *)&constraint,&member_decorations.begin);
        this_00 = vstate_local;
        if (!bVar2) break;
        pDVar10 = std::_Rb_tree_const_iterator<spvtools::val::Decoration>::operator->
                            ((_Rb_tree_const_iterator<spvtools::val::Decoration> *)&constraint);
        uVar7 = Decoration::struct_member_index(pDVar10);
        if (uVar7 != (uint32_t)lastMember) {
          __assert_fail("decoration->struct_member_index() == (int)lastIdx",
                        "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_decorations.cpp"
                        ,0x160,
                        "uint32_t spvtools::val::(anonymous namespace)::getSize(uint32_t, const LayoutConstraints &, MemberConstraints &, ValidationState_t &)"
                       );
        }
        pDVar10 = std::_Rb_tree_const_iterator<spvtools::val::Decoration>::operator->
                            ((_Rb_tree_const_iterator<spvtools::val::Decoration> *)&constraint);
        DVar6 = Decoration::dec_type(pDVar10);
        if (DVar6 == DecorationOffset) {
          pDVar10 = std::_Rb_tree_const_iterator<spvtools::val::Decoration>::operator->
                              ((_Rb_tree_const_iterator<spvtools::val::Decoration> *)&constraint);
          pvVar11 = Decoration::params(pDVar10);
          pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar11,0);
          member_decorations.end._M_node._4_4_ = *pvVar12;
        }
        std::_Rb_tree_const_iterator<spvtools::val::Decoration>::operator++
                  ((_Rb_tree_const_iterator<spvtools::val::Decoration> *)&constraint);
      }
      if (member_decorations.end._M_node._4_4_ == 0xffffffff) {
        __assert_fail("offset != 0xffffffff",
                      "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_decorations.cpp"
                      ,0x167,
                      "uint32_t spvtools::val::(anonymous namespace)::getSize(uint32_t, const LayoutConstraints &, MemberConstraints &, ValidationState_t &)"
                     );
      }
      local_e0 = std::make_pair<unsigned_int_const&,unsigned_int_const&>(pvVar9,(uint *)&lastMember)
      ;
      local_d8 = std::
                 unordered_map<std::pair<unsigned_int,_unsigned_int>,_spvtools::val::(anonymous_namespace)::LayoutConstraints,_spvtools::val::(anonymous_namespace)::PairHash,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_spvtools::val::(anonymous_namespace)::LayoutConstraints>_>_>
                 ::operator[]((unordered_map<std::pair<unsigned_int,_unsigned_int>,_spvtools::val::(anonymous_namespace)::LayoutConstraints,_spvtools::val::(anonymous_namespace)::PairHash,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_spvtools::val::(anonymous_namespace)::LayoutConstraints>_>_>
                               *)this_00,&local_e0);
      vVar1 = member_decorations.end._M_node._4_4_;
      uVar7 = getSize(*pvVar9,local_d8,(MemberConstraints *)vstate_local,(ValidationState_t *)inst);
      inherited_local._4_4_ = vVar1 + uVar7;
    }
    lastMember._4_4_ = 1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&lastIdx);
  }
  else {
    if ((OVar3 != OpTypePointer) && (OVar3 != OpTypeUntypedPointerKHR)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_decorations.cpp"
                    ,0x16f,
                    "uint32_t spvtools::val::(anonymous namespace)::getSize(uint32_t, const LayoutConstraints &, MemberConstraints &, ValidationState_t &)"
                   );
    }
    inherited_local._4_4_ = ValidationState_t::pointer_size_and_alignment((ValidationState_t *)inst)
    ;
  }
  return inherited_local._4_4_;
}

Assistant:

uint32_t getSize(uint32_t member_id, const LayoutConstraints& inherited,
                 MemberConstraints& constraints, ValidationState_t& vstate) {
  const auto inst = vstate.FindDef(member_id);
  const auto& words = inst->words();
  switch (inst->opcode()) {
    case spv::Op::OpTypeSampledImage:
    case spv::Op::OpTypeSampler:
    case spv::Op::OpTypeImage:
      if (vstate.HasCapability(spv::Capability::BindlessTextureNV))
        return vstate.samplerimage_variable_address_mode() / 8;
      assert(0);
      return 0;
    case spv::Op::OpTypeInt:
    case spv::Op::OpTypeFloat:
      return words[2] / 8;
    case spv::Op::OpTypeVector: {
      const auto componentId = words[2];
      const auto numComponents = words[3];
      const auto componentSize =
          getSize(componentId, inherited, constraints, vstate);
      const auto size = componentSize * numComponents;
      return size;
    }
    case spv::Op::OpTypeArray: {
      const auto sizeInst = vstate.FindDef(words[3]);
      if (spvOpcodeIsSpecConstant(sizeInst->opcode())) return 0;
      assert(spv::Op::OpConstant == sizeInst->opcode());
      const uint32_t num_elem = sizeInst->words()[3];
      const uint32_t elem_type = words[2];
      const uint32_t elem_size =
          getSize(elem_type, inherited, constraints, vstate);
      // Account for gaps due to alignments in the first N-1 elements,
      // then add the size of the last element.
      const auto size =
          (num_elem - 1) * GetArrayStride(member_id, vstate) + elem_size;
      return size;
    }
    case spv::Op::OpTypeRuntimeArray:
      return 0;
    case spv::Op::OpTypeMatrix: {
      const auto num_columns = words[3];
      if (inherited.majorness == kColumnMajor) {
        return num_columns * inherited.matrix_stride;
      } else {
        // Row major case.
        const auto column_type = words[2];
        const auto component_inst = vstate.FindDef(column_type);
        const auto num_rows = component_inst->words()[3];
        const auto scalar_elem_type = component_inst->words()[2];
        const uint32_t scalar_elem_size =
            getSize(scalar_elem_type, inherited, constraints, vstate);
        return (num_rows - 1) * inherited.matrix_stride +
               num_columns * scalar_elem_size;
      }
    }
    case spv::Op::OpTypeStruct: {
      const auto& members = getStructMembers(member_id, vstate);
      if (members.empty()) return 0;
      const auto lastIdx = uint32_t(members.size() - 1);
      const auto& lastMember = members.back();
      uint32_t offset = 0xffffffff;
      // Find the offset of the last element and add the size.
      auto member_decorations =
          vstate.id_member_decorations(member_id, lastIdx);
      for (auto decoration = member_decorations.begin;
           decoration != member_decorations.end; ++decoration) {
        assert(decoration->struct_member_index() == (int)lastIdx);
        if (spv::Decoration::Offset == decoration->dec_type()) {
          offset = decoration->params()[0];
        }
      }
      // This check depends on the fact that all members have offsets.  This
      // has been checked earlier in the flow.
      assert(offset != 0xffffffff);
      const auto& constraint = constraints[std::make_pair(lastMember, lastIdx)];
      return offset + getSize(lastMember, constraint, constraints, vstate);
    }
    case spv::Op::OpTypePointer:
    case spv::Op::OpTypeUntypedPointerKHR:
      return vstate.pointer_size_and_alignment();
    default:
      assert(0);
      return 0;
  }
}